

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O2

baseHolder * __thiscall cs_impl::any::holder<cs::type_t>::duplicate(holder<cs::type_t> *this)

{
  holder<cs::type_t> *phVar1;
  
  phVar1 = cs::
           allocator_type<cs_impl::any::holder<cs::type_t>,64ul,cs_impl::default_allocator_provider>
           ::alloc<cs::type_t&>
                     ((allocator_type<cs_impl::any::holder<cs::type_t>,64ul,cs_impl::default_allocator_provider>
                       *)allocator,&this->mDat);
  return &phVar1->super_baseHolder;
}

Assistant:

baseHolder *duplicate() override
			{
				return allocator.alloc(mDat);
			}